

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRHeadTrackingNode.cpp
# Opt level: O2

void __thiscall
MinVR::VRHeadTrackingNode::VRHeadTrackingNode
          (VRHeadTrackingNode *this,string *name,string *headTrackingEventName,
          VRMatrix4 *initialHeadMatrix)

{
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  allocator<char> local_41;
  value_type local_40;
  
  VRDisplayNode::VRDisplayNode(&this->super_VRDisplayNode,name);
  (this->super_VRDisplayNode)._vptr_VRDisplayNode = (_func_int **)&PTR__VRHeadTrackingNode_0015d738;
  (this->super_VREventHandler)._vptr_VREventHandler = (_func_int **)&DAT_0015d7a8;
  VRMatrix4::VRMatrix4(&this->_headMatrix,initialHeadMatrix);
  std::__cxx11::string::string((string *)&this->_trackingEvent,(string *)headTrackingEventName);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"HeadMatrix",&local_41);
  this_00 = &(this->super_VRDisplayNode)._valuesAdded;
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this_00,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"CameraMatrix",&local_41);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this_00,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

VRHeadTrackingNode::VRHeadTrackingNode(const std::string &name, const std::string &headTrackingEventName, VRMatrix4 initialHeadMatrix) :
    VRDisplayNode(name), _headMatrix(initialHeadMatrix), _trackingEvent(headTrackingEventName)
{
  _valuesAdded.push_back("HeadMatrix");
  _valuesAdded.push_back("CameraMatrix");
}